

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O2

NodePosi __thiscall
QuadList<SSTableDataEntry>::insertAfterAbove
          (QuadList<SSTableDataEntry> *this,SSTableDataEntry *data,NodePosi pred_node,
          NodePosi below_node)

{
  QuadListNode<SSTableDataEntry> *pQVar1;
  NodePosi this_00;
  undefined1 auStack_68 [64];
  
  this_00 = (NodePosi)operator_new(0x60);
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)auStack_68,data);
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)this_00,(SSTableDataEntry *)auStack_68);
  this_00->above = (QuadListNode<SSTableDataEntry> *)0x0;
  this_00->below = (QuadListNode<SSTableDataEntry> *)0x0;
  this_00->pred = (QuadListNode<SSTableDataEntry> *)0x0;
  this_00->succ = (QuadListNode<SSTableDataEntry> *)0x0;
  std::__cxx11::string::~string((string *)(auStack_68 + 0x20));
  pQVar1 = pred_node->succ;
  this_00->pred = pred_node;
  this_00->succ = pQVar1;
  pQVar1->pred = this_00;
  pred_node->succ = this_00;
  if (below_node != (NodePosi)0x0) {
    this_00->below = below_node;
    below_node->above = this_00;
  }
  this->_size = this->_size + 1;
  return this_00;
}

Assistant:

auto QuadList<T>::insertAfterAbove(T data, NodePosi pred_node, NodePosi below_node) {
    auto *new_node = new Node(data);
    pred_node->insertAfterSucc(new_node, below_node);
    _size++;
    return const_cast<const NodePosi &>(new_node);
}